

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

void __thiscall MT32Emu::Synth::playSysexWithoutFraming(Synth *this,Bit8u *sysex,Bit32u len)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  char *fmt;
  ulong uVar4;
  ulong uVar5;
  
  if (len < 4) {
    printDebug(this,"playSysexWithoutFraming: Message is too short (%d bytes)!",len);
    return;
  }
  uVar3 = (ulong)*sysex;
  if (*sysex == 0x41) {
    bVar1 = sysex[2];
    uVar4 = (ulong)bVar1;
    if (bVar1 == 0x16) {
      playSysexWithoutHeader(this,sysex[1],sysex[3],sysex + 4,len - 4);
      return;
    }
    if (bVar1 == 0x14) {
      uVar2 = (ulong)sysex[1];
      uVar5 = (ulong)sysex[3];
      fmt = 
      "playSysexWithoutFraming: Header is intended for model D-50 (not yet supported): %02x %02x %02x %02x"
      ;
      uVar3 = 0x41;
      uVar4 = 0x14;
    }
    else {
      uVar2 = (ulong)sysex[1];
      uVar5 = (ulong)sysex[3];
      fmt = "playSysexWithoutFraming: Header not intended for model MT-32: %02x %02x %02x %02x";
      uVar3 = 0x41;
    }
  }
  else {
    uVar2 = (ulong)sysex[1];
    uVar4 = (ulong)sysex[2];
    uVar5 = (ulong)sysex[3];
    fmt = 
    "playSysexWithoutFraming: Header not intended for this device manufacturer: %02x %02x %02x %02x"
    ;
  }
  printDebug(this,fmt,uVar3,uVar2,uVar4,uVar5);
  return;
}

Assistant:

void Synth::playSysexWithoutFraming(const Bit8u *sysex, Bit32u len) {
	if (len < 4) {
		printDebug("playSysexWithoutFraming: Message is too short (%d bytes)!", len);
		return;
	}
	if (sysex[0] != SYSEX_MANUFACTURER_ROLAND) {
		printDebug("playSysexWithoutFraming: Header not intended for this device manufacturer: %02x %02x %02x %02x", int(sysex[0]), int(sysex[1]), int(sysex[2]), int(sysex[3]));
		return;
	}
	if (sysex[2] == SYSEX_MDL_D50) {
		printDebug("playSysexWithoutFraming: Header is intended for model D-50 (not yet supported): %02x %02x %02x %02x", int(sysex[0]), int(sysex[1]), int(sysex[2]), int(sysex[3]));
		return;
	} else if (sysex[2] != SYSEX_MDL_MT32) {
		printDebug("playSysexWithoutFraming: Header not intended for model MT-32: %02x %02x %02x %02x", int(sysex[0]), int(sysex[1]), int(sysex[2]), int(sysex[3]));
		return;
	}
	playSysexWithoutHeader(sysex[1], sysex[3], sysex + 4, len - 4);
}